

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

uint64_t compress_bits(uint64_t x,int n)

{
  int local_18;
  int sh;
  int i;
  int n_local;
  uint64_t x_local;
  
  _i = x;
  for (local_18 = n; local_18 < 5; local_18 = local_18 + 1) {
    _i = (even_bit_esz_masks[local_18] & _i) >> ((byte)(1 << ((byte)local_18 & 0x1f)) & 0x3f) |
         even_bit_esz_masks[local_18] & _i;
  }
  return _i & 0xffffffff;
}

Assistant:

static uint64_t compress_bits(uint64_t x, int n)
{
    int i;

    for (i = n; i <= 4; i++) {
        int sh = 1 << i;
        x &= even_bit_esz_masks[i];
        x = (x >> sh) | x;
    }
    return x & 0xffffffffu;
}